

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O0

void __thiscall duckdb_shell::ModeBoxRenderer::print_box_line(ModeBoxRenderer *this,idx_t N)

{
  ulong in_RSI;
  ShellState *in_RDI;
  idx_t i;
  string box_line;
  string *in_stack_ffffffffffffffa8;
  ulong local_38;
  string local_30 [32];
  ulong local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30);
  for (local_38 = 0; local_38 < local_10; local_38 = local_38 + 1) {
    std::__cxx11::string::operator+=(local_30,anon_var_dwarf_13e93);
  }
  ShellState::Print(in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void print_box_line(idx_t N) {
		string box_line;
		for (idx_t i = 0; i < N; i++) {
			box_line += BOX_24;
		}
		state.Print(box_line);
	}